

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_wrapper.cpp
# Opt level: O0

shared_ptr<duckdb::ArrowArrayWrapper,_true> __thiscall
duckdb::ArrowArrayStreamWrapper::GetNextChunk(ArrowArrayStreamWrapper *this)

{
  code *pcVar1;
  int iVar2;
  ArrowArrayWrapper *pAVar3;
  undefined8 uVar4;
  char *pcVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<duckdb::ArrowArrayWrapper,_true> sVar6;
  shared_ptr<duckdb::ArrowArrayWrapper,_true> *current_chunk;
  shared_ptr<duckdb::ArrowArrayWrapper,_true> *in_stack_ffffffffffffff30;
  allocator *paVar7;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  InvalidInputException *in_stack_ffffffffffffffa0;
  allocator local_49;
  string local_48 [55];
  undefined1 local_11;
  
  local_11 = 0;
  make_shared_ptr<duckdb::ArrowArrayWrapper>();
  pcVar1 = *(code **)(in_RSI + 0x10);
  pAVar3 = shared_ptr<duckdb::ArrowArrayWrapper,_true>::operator->(in_stack_ffffffffffffff30);
  iVar2 = (*pcVar1)(in_RSI + 8,pAVar3);
  if (iVar2 == 0) {
    sVar6.internal.super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar6.internal.super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = in_RDI;
    return (shared_ptr<duckdb::ArrowArrayWrapper,_true>)
           sVar6.internal.super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar4 = __cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_48,"arrow_scan: get_next failed(): %s",&local_49);
  pcVar5 = GetError((ArrowArrayStreamWrapper *)0x1528d98);
  paVar7 = &local_71;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&stack0xffffffffffffff90,pcVar5,paVar7);
  InvalidInputException::InvalidInputException<std::__cxx11::string>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  __cxa_throw(uVar4,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
}

Assistant:

shared_ptr<ArrowArrayWrapper> ArrowArrayStreamWrapper::GetNextChunk() {
	auto current_chunk = make_shared_ptr<ArrowArrayWrapper>();
	if (arrow_array_stream.get_next(&arrow_array_stream, &current_chunk->arrow_array)) { // LCOV_EXCL_START
		throw InvalidInputException("arrow_scan: get_next failed(): %s", string(GetError()));
	} // LCOV_EXCL_STOP

	return current_chunk;
}